

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_plus2(LispPTR tosm1,LispPTR tos)

{
  LispPTR *pLVar1;
  uint *NAddr;
  uint uVar2;
  int *fixpp;
  int result;
  int arg2;
  int arg1;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if ((tos & 0xfff0000) == 0xe0000) {
    result = tos & 0xffff;
LAB_00107a03:
    if ((tosm1 & 0xfff0000) == 0xe0000) {
      fixpp._4_4_ = tosm1 & 0xffff;
    }
    else if ((tosm1 & 0xfff0000) == 0xf0000) {
      fixpp._4_4_ = tosm1 | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (tosm1 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00107b18;
      pLVar1 = NativeAligned4FromLAddr(tosm1);
      fixpp._4_4_ = *pLVar1;
    }
    uVar2 = result + fixpp._4_4_;
    if (SCARRY4(result,fixpp._4_4_)) {
      MachineState.errorexit = 1;
      tos_local = 0xffffffff;
      MachineState.tosvalue = tos;
    }
    else if (uVar2 >> 0x10 == 0xffff) {
      tos_local = uVar2 & 0xffff | 0xf0000;
    }
    else if (uVar2 >> 0x10 == 0) {
      tos_local = uVar2 | 0xe0000;
    }
    else {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar2;
      tos_local = LAddrFromNative(NAddr);
    }
  }
  else {
    if ((tos & 0xfff0000) == 0xf0000) {
      result = tos | 0xffff0000;
      goto LAB_00107a03;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar1 = NativeAligned4FromLAddr(tos);
      result = *pLVar1;
      goto LAB_00107a03;
    }
LAB_00107b18:
    tos_local = N_OP_fplus2(tosm1,tos);
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_plus2(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_GETNUMBER(tos, arg1, doufn);
  N_GETNUMBER(tosm1, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else
  /* UB: signed integer overflow: 2147483647 + 2147483647 cannot be represented in type 'int' */
  result = arg1 + arg2;
  if (((arg1 >= 0) == (arg2 >= 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

doufn:
  return (N_OP_fplus2(tosm1, tos));
}